

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::~COpenGLCoreCacheHandler
          (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this)

{
  this->_vptr_COpenGLCoreCacheHandler = (_func_int **)&PTR__COpenGLCoreCacheHandler_00280cb8;
  if (this->BlendEquation != (GLenum *)0x0) {
    operator_delete__(this->BlendEquation);
  }
  if (this->BlendSourceRGB != (GLenum *)0x0) {
    operator_delete__(this->BlendSourceRGB);
  }
  if (this->BlendDestinationRGB != (GLenum *)0x0) {
    operator_delete__(this->BlendDestinationRGB);
  }
  if (this->BlendSourceAlpha != (GLenum *)0x0) {
    operator_delete__(this->BlendSourceAlpha);
  }
  if (this->BlendDestinationAlpha != (GLenum *)0x0) {
    operator_delete__(this->BlendDestinationAlpha);
  }
  if (this->Blend != (bool *)0x0) {
    operator_delete__(this->Blend);
  }
  if (this->ColorMask != (u8 *)0x0) {
    operator_delete__(this->ColorMask);
  }
  STextureCache::clear(&this->TextureCache);
  return;
}

Assistant:

virtual ~COpenGLCoreCacheHandler()
	{
		delete[] BlendEquation;
		delete[] BlendSourceRGB;
		delete[] BlendDestinationRGB;
		delete[] BlendSourceAlpha;
		delete[] BlendDestinationAlpha;
		delete[] Blend;

		delete[] ColorMask;
	}